

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::TestCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  BackgroundCommand *this_00;
  Output local_50;
  char *params_local;
  string local_40 [32];
  
  params_local = params;
  this_00 = (BackgroundCommand *)operator_new(0x50);
  this_00->engine = this->engine;
  this_00->_vptr_BackgroundCommand = (_func_int **)&PTR__TestCommandHandle_00157c80;
  this_00[3]._vptr_BackgroundCommand = (_func_int **)(this_00 + 4);
  this_00[3].engine = (ChessEngine *)0x0;
  *(undefined1 *)&this_00[4]._vptr_BackgroundCommand = 0;
  if (((params == (char *)0x0) || (*params == '\0')) ||
     (bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local), bVar1)) {
    Output::Output(&local_50,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    (*this_00->_vptr_BackgroundCommand[3])(local_40,this_00);
    std::operator<<((ostream *)&std::cout,local_40);
    std::__cxx11::string::~string(local_40);
    Output::~Output(&local_50);
    Output::Output(&local_50,InfoPrefix);
    (*this_00->_vptr_BackgroundCommand[4])(local_40,this_00);
    std::operator<<((ostream *)&std::cout,local_40);
    std::__cxx11::string::~string(local_40);
    Output::~Output(&local_50);
  }
  else {
    bVar1 = BackgroundCommand::ParseAndExecute(this_00,params_local,&this->thread);
    if (bVar1) {
      return;
    }
  }
  (*this_00->_vptr_BackgroundCommand[1])(this_00);
  return;
}

Assistant:

void UCIAdapter::TestCommand(const char* params)
{
  TestCommandHandle* handle = new TestCommandHandle(engine);
  if (!handle) {
    Output() << "Out of memory";
    return;
  }

  if (!params || !*params || ParamMatch(token::Help, params)) {
    Output() << "usage: " << handle->Usage();
    Output() << handle->Description();
  }
  else if (handle->ParseAndExecute(params, thread)) {
    return;
  }

  delete handle;
  handle = NULL;
}